

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralAction::~IfcStructuralAction(IfcStructuralAction *this)

{
  IfcStructuralActivity *this_00;
  long *plVar1;
  long lVar2;
  
  lVar2 = *(long *)(*(long *)&(this->super_IfcStructuralActivity).super_IfcProduct.super_IfcObject +
                   -0x18);
  this_00 = (IfcStructuralActivity *)
            (&(this->super_IfcStructuralActivity).super_IfcProduct.super_IfcObject.field_0x0 + lVar2
            );
  plVar1 = (long *)(&this->field_0x158 + lVar2);
  plVar1[-0x2b] = 0x840780;
  plVar1[4] = 0x840870;
  plVar1[-0x1a] = 0x8407a8;
  plVar1[-0x18] = 0x8407d0;
  plVar1[-0x11] = 0x8407f8;
  plVar1[-0xb] = 0x840820;
  plVar1[-4] = 0x840848;
  if ((long *)plVar1[-2] != plVar1) {
    operator_delete((long *)plVar1[-2],*plVar1 + 1);
  }
  IfcStructuralActivity::~IfcStructuralActivity(this_00,&PTR_construction_vtable_24__00840888);
  operator_delete(this_00,400);
  return;
}

Assistant:

IfcStructuralAction() : Object("IfcStructuralAction") {}